

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_DUBT_findBetterDictMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,size_t bestLength,
                 U32 nbCompares,U32 mls,ZSTD_dictMode_e dictMode)

{
  uint uVar1;
  uint uVar2;
  ZSTD_matchState_t *pZVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  BYTE *mEnd;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  size_t sVar14;
  U32 *local_118;
  uint local_10c;
  U32 mIndex;
  U32 matchIndex;
  BYTE *match;
  size_t matchLength;
  U32 *nextPtr;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btLow;
  U32 btMask;
  U32 btLog;
  U32 *dictBt;
  U32 dictIndexDelta;
  U32 dictLowLimit;
  U32 dictHighLimit;
  BYTE *dictEnd;
  BYTE *dictBase;
  U32 curr;
  BYTE *prefixStart;
  BYTE *base;
  U32 dictMatchIndex;
  size_t h;
  U32 hashLog;
  U32 *dictHashTable;
  ZSTD_compressionParameters *dmsCParams;
  ZSTD_matchState_t *dms;
  U32 *pUStack_48;
  U32 nbCompares_local;
  size_t bestLength_local;
  size_t *offsetPtr_local;
  BYTE *iend_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  size_t local_10;
  
  pZVar3 = ms->dictMatchState;
  pUVar4 = pZVar3->hashTable;
  uVar1 = (pZVar3->cParams).hashLog;
  if (0x20 < uVar1) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  switch(mls) {
  default:
    local_10 = ZSTD_hash4Ptr(ip,uVar1);
    break;
  case 5:
    local_10 = ZSTD_hash5Ptr(ip,uVar1);
    break;
  case 6:
    local_10 = ZSTD_hash6Ptr(ip,uVar1);
    break;
  case 7:
    local_10 = ZSTD_hash7Ptr(ip,uVar1);
    break;
  case 8:
    local_10 = ZSTD_hash8Ptr(ip,uVar1);
  }
  base._4_4_ = pUVar4[local_10];
  pBVar5 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  iVar7 = (int)ip - (int)pBVar5;
  pBVar6 = (pZVar3->window).base;
  mEnd = (pZVar3->window).nextSrc;
  uVar8 = (int)(pZVar3->window).nextSrc - (int)(pZVar3->window).base;
  uVar2 = (pZVar3->window).lowLimit;
  uVar9 = (ms->window).lowLimit - uVar8;
  pUVar4 = pZVar3->chainTable;
  uVar10 = (1 << ((char)(pZVar3->cParams).chainLog - 1U & 0x1f)) - 1;
  local_10c = uVar2;
  if (uVar10 < uVar8 - uVar2) {
    local_10c = uVar8 - uVar10;
  }
  commonLengthLarger = 0;
  nextPtr = (U32 *)0x0;
  dms._4_4_ = nbCompares;
  pUStack_48 = (U32 *)bestLength;
  if (dictMode != ZSTD_dictMatchState) {
    __assert_fail("dictMode == ZSTD_dictMatchState",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0xbd,
                  "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                 );
  }
  for (; dms._4_4_ != 0 && uVar2 < base._4_4_; dms._4_4_ = dms._4_4_ - 1) {
    if (commonLengthLarger < nextPtr) {
      local_118 = (U32 *)commonLengthLarger;
    }
    else {
      local_118 = nextPtr;
    }
    _mIndex = pBVar6 + base._4_4_;
    sVar14 = ZSTD_count_2segments
                       (ip + (long)local_118,_mIndex + (long)local_118,iend,mEnd,pBVar5 + uVar1);
    local_118 = (U32 *)(sVar14 + (long)local_118);
    if ((ulong)uVar8 <= (ulong)base._4_4_ + (long)local_118) {
      _mIndex = pBVar5 + (ulong)uVar9 + (ulong)base._4_4_;
    }
    if (pUStack_48 < local_118) {
      iVar11 = base._4_4_ + uVar9;
      uVar12 = ZSTD_highbit32((iVar7 - iVar11) + 1);
      uVar13 = ZSTD_highbit32((int)*offsetPtr + 1);
      if ((int)(uVar12 - uVar13) < ((int)local_118 - (int)pUStack_48) * 4) {
        if (iVar7 == iVar11) {
          __assert_fail("(curr - matchIndex)>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                        ,0xcc,
                        "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                       );
        }
        *offsetPtr = (ulong)((iVar7 - iVar11) + 3);
        pUStack_48 = local_118;
      }
      if (ip + (long)local_118 == iend) break;
    }
    if (_mIndex[(long)local_118] < ip[(long)local_118]) {
      if (base._4_4_ <= local_10c) break;
      base._4_4_ = (pUVar4 + ((base._4_4_ & uVar10) << 1))[1];
      commonLengthLarger = (size_t)local_118;
    }
    else {
      if (base._4_4_ <= local_10c) break;
      base._4_4_ = pUVar4[(base._4_4_ & uVar10) << 1];
      nextPtr = local_118;
    }
  }
  if (((U32 *)0x2 < pUStack_48) && (*offsetPtr < 4)) {
    __assert_fail("OFFBASE_IS_OFFSET(*offsetPtr)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0xe0,
                  "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                 );
  }
  return (size_t)pUStack_48;
}

Assistant:

static size_t
ZSTD_DUBT_findBetterDictMatch (
        const ZSTD_matchState_t* ms,
        const BYTE* const ip, const BYTE* const iend,
        size_t* offsetPtr,
        size_t bestLength,
        U32 nbCompares,
        U32 const mls,
        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_matchState_t * const dms = ms->dictMatchState;
    const ZSTD_compressionParameters* const dmsCParams = &dms->cParams;
    const U32 * const dictHashTable = dms->hashTable;
    U32         const hashLog = dmsCParams->hashLog;
    size_t      const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32               dictMatchIndex = dictHashTable[h];

    const BYTE* const base = ms->window.base;
    const BYTE* const prefixStart = base + ms->window.dictLimit;
    U32         const curr = (U32)(ip-base);
    const BYTE* const dictBase = dms->window.base;
    const BYTE* const dictEnd = dms->window.nextSrc;
    U32         const dictHighLimit = (U32)(dms->window.nextSrc - dms->window.base);
    U32         const dictLowLimit = dms->window.lowLimit;
    U32         const dictIndexDelta = ms->window.lowLimit - dictHighLimit;

    U32*        const dictBt = dms->chainTable;
    U32         const btLog  = dmsCParams->chainLog - 1;
    U32         const btMask = (1 << btLog) - 1;
    U32         const btLow = (btMask >= dictHighLimit - dictLowLimit) ? dictLowLimit : dictHighLimit - btMask;

    size_t commonLengthSmaller=0, commonLengthLarger=0;

    (void)dictMode;
    assert(dictMode == ZSTD_dictMatchState);

    for (; nbCompares && (dictMatchIndex > dictLowLimit); --nbCompares) {
        U32* const nextPtr = dictBt + 2*(dictMatchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        const BYTE* match = dictBase + dictMatchIndex;
        matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
        if (dictMatchIndex+matchLength >= dictHighLimit)
            match = base + dictMatchIndex + dictIndexDelta;   /* to prepare for next usage of match[matchLength] */

        if (matchLength > bestLength) {
            U32 matchIndex = dictMatchIndex + dictIndexDelta;
            if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) ) {
                DEBUGLOG(9, "ZSTD_DUBT_findBetterDictMatch(%u) : found better match length %u -> %u and offsetCode %u -> %u (dictMatchIndex %u, matchIndex %u)",
                    curr, (U32)bestLength, (U32)matchLength, (U32)*offsetPtr, OFFSET_TO_OFFBASE(curr - matchIndex), dictMatchIndex, matchIndex);
                bestLength = matchLength, *offsetPtr = OFFSET_TO_OFFBASE(curr - matchIndex);
            }
            if (ip+matchLength == iend) {   /* reached end of input : ip[matchLength] is not valid, no way to know if it's larger or smaller than match */
                break;   /* drop, to guarantee consistency (miss a little bit of compression) */
            }
        }

        if (match[matchLength] < ip[matchLength]) {
            if (dictMatchIndex <= btLow) { break; }   /* beyond tree size, stop the search */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            dictMatchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
        } else {
            /* match is larger than current */
            if (dictMatchIndex <= btLow) { break; }   /* beyond tree size, stop the search */
            commonLengthLarger = matchLength;
            dictMatchIndex = nextPtr[0];
        }
    }

    if (bestLength >= MINMATCH) {
        U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offsetPtr); (void)mIndex;
        DEBUGLOG(8, "ZSTD_DUBT_findBetterDictMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                    curr, (U32)bestLength, (U32)*offsetPtr, mIndex);
    }
    return bestLength;

}